

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

void Ver_ParseStop(Ver_Man_t *p)

{
  Ver_Man_t *p_local;
  
  if (p->pProgress != (ProgressBar *)0x0) {
    Extra_ProgressBarStop(p->pProgress);
  }
  Ver_StreamFree(p->pReader);
  Vec_PtrFree(p->vNames);
  Vec_PtrFree(p->vStackFn);
  Vec_IntFree(p->vStackOp);
  Vec_IntFree(p->vPerm);
  if (p != (Ver_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Ver_ParseStop( Ver_Man_t * p )
{
    if ( p->pProgress )
        Extra_ProgressBarStop( p->pProgress );
    Ver_StreamFree( p->pReader );
    Vec_PtrFree( p->vNames   );
    Vec_PtrFree( p->vStackFn );
    Vec_IntFree( p->vStackOp );
    Vec_IntFree( p->vPerm );
    ABC_FREE( p );
}